

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_color nk_rgb_hex(char *rgb)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  char *c;
  long lVar7;
  int iVar8;
  bool bVar9;
  
  bVar9 = *rgb == '#';
  lVar7 = 0;
  uVar3 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    bVar1 = rgb[lVar7 + (ulong)bVar9];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar4 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar4 = bVar1 - 0x37;
    }
    else {
      iVar4 = bVar1 - 0x30;
    }
    uVar3 = uVar3 * 0x10 + iVar4;
    lVar7 = 1;
    uVar5 = 0;
    bVar2 = false;
  } while (bVar6);
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    bVar1 = rgb[lVar7 + (ulong)bVar9 + 2];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar4 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar4 = bVar1 - 0x37;
    }
    else {
      iVar4 = bVar1 - 0x30;
    }
    uVar5 = uVar5 * 0x10 + iVar4;
    lVar7 = 1;
    iVar4 = 0;
    bVar2 = false;
  } while (bVar6);
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    bVar1 = rgb[lVar7 + (ulong)bVar9 + 4];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar8 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar8 = bVar1 - 0x37;
    }
    else {
      iVar8 = bVar1 - 0x30;
    }
    iVar4 = iVar4 * 0x10 + iVar8;
    lVar7 = 1;
    bVar2 = false;
  } while (bVar6);
  return (nk_color)(uVar3 & 0xff | (uVar5 & 0xff) << 8 | iVar4 * 0x10000 | 0xff000000);
}

Assistant:

NK_API struct nk_color
nk_rgb_hex(const char *rgb)
{
    struct nk_color col;
    const char *c = rgb;
    if (*c == '#') c++;
    col.r = (nk_byte)nk_parse_hex(c, 2);
    col.g = (nk_byte)nk_parse_hex(c+2, 2);
    col.b = (nk_byte)nk_parse_hex(c+4, 2);
    col.a = 255;
    return col;
}